

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

bool __thiscall cmMessenger::IsMessageTypeVisible(cmMessenger *this,MessageType t)

{
  bool local_15;
  bool isVisible;
  MessageType t_local;
  cmMessenger *this_local;
  
  local_15 = true;
  if (t == DEPRECATION_ERROR) {
    local_15 = GetDeprecatedWarningsAsErrors(this);
  }
  else if (t == DEPRECATION_WARNING) {
    local_15 = GetSuppressDeprecatedWarnings(this);
    local_15 = !local_15;
  }
  else if (t == AUTHOR_ERROR) {
    local_15 = GetDevWarningsAsErrors(this);
  }
  else if (t == AUTHOR_WARNING) {
    local_15 = GetSuppressDevWarnings(this);
    local_15 = !local_15;
  }
  return local_15;
}

Assistant:

bool cmMessenger::IsMessageTypeVisible(cmake::MessageType t) const
{
  bool isVisible = true;

  if (t == cmake::DEPRECATION_ERROR) {
    if (!this->GetDeprecatedWarningsAsErrors()) {
      isVisible = false;
    }
  } else if (t == cmake::DEPRECATION_WARNING) {
    if (this->GetSuppressDeprecatedWarnings()) {
      isVisible = false;
    }
  } else if (t == cmake::AUTHOR_ERROR) {
    if (!this->GetDevWarningsAsErrors()) {
      isVisible = false;
    }
  } else if (t == cmake::AUTHOR_WARNING) {
    if (this->GetSuppressDevWarnings()) {
      isVisible = false;
    }
  }

  return isVisible;
}